

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

void Service_CreateSession
               (UA_Server *server,UA_SecureChannel *channel,UA_CreateSessionRequest *request,
               UA_CreateSessionResponse *response)

{
  UA_Byte **sm;
  UA_StatusCode *pUVar1;
  size_t sVar2;
  undefined2 uVar3;
  UA_NodeIdType UVar4;
  UA_Session *pUVar5;
  UA_CreateSessionRequest *pUVar6;
  UA_StatusCode UVar7;
  UA_SecureChannel *channel_00;
  long lVar8;
  ulong uVar9;
  UA_Session *local_50;
  UA_Session *newSession;
  UA_SecureChannel *local_40;
  UA_CreateSessionRequest *local_38;
  
  if ((channel->securityToken).channelId == 0) {
    (response->responseHeader).serviceResult = 0x80220000;
  }
  else {
    channel_00 = (UA_SecureChannel *)server->endpointDescriptionsSize;
    UVar7 = UA_Array_copy(server->endpointDescriptions,(size_t)channel_00,&response->serverEndpoints
                          ,UA_TYPES + 0x9b);
    (response->responseHeader).serviceResult = UVar7;
    if (UVar7 == 0) {
      sVar2 = server->endpointDescriptionsSize;
      response->serverEndpointsSize = sVar2;
      newSession = (UA_Session *)server;
      local_40 = channel;
      local_38 = request;
      if (sVar2 != 0) {
        lVar8 = 0;
        uVar9 = 0;
        do {
          channel_00 = (UA_SecureChannel *)
                       ((long)&(response->serverEndpoints->endpointUrl).length + lVar8);
          UA_copy(&request->endpointUrl,channel_00,UA_TYPES + 0xb);
          uVar9 = uVar9 + 1;
          lVar8 = lVar8 + 0xd8;
        } while (uVar9 < response->serverEndpointsSize);
      }
      pUVar6 = local_38;
      pUVar5 = newSession;
      sm = &(newSession->clientDescription).applicationName.text.data;
      UVar7 = UA_SessionManager_createSession((UA_SessionManager *)sm,channel_00,local_38,&local_50)
      ;
      (response->responseHeader).serviceResult = UVar7;
      if (UVar7 == 0) {
        local_50->maxResponseMessageSize = pUVar6->maxResponseMessageSize;
        local_50->maxRequestMessageSize = (local_40->connection->localConf).maxMessageSize;
        (response->sessionId).identifier.string.data = (local_50->sessionId).identifier.string.data;
        uVar3 = *(undefined2 *)&(local_50->sessionId).field_0x2;
        UVar4 = (local_50->sessionId).identifierType;
        sVar2 = (local_50->sessionId).identifier.string.length;
        (response->sessionId).namespaceIndex = (local_50->sessionId).namespaceIndex;
        *(undefined2 *)&(response->sessionId).field_0x2 = uVar3;
        (response->sessionId).identifierType = UVar4;
        (response->sessionId).identifier.string.length = sVar2;
        response->revisedSessionTimeout = local_50->timeout;
        uVar3 = *(undefined2 *)&(local_50->authenticationToken).field_0x2;
        UVar4 = (local_50->authenticationToken).identifierType;
        sVar2 = (local_50->authenticationToken).identifier.string.length;
        (response->authenticationToken).namespaceIndex =
             (local_50->authenticationToken).namespaceIndex;
        *(undefined2 *)&(response->authenticationToken).field_0x2 = uVar3;
        (response->authenticationToken).identifierType = UVar4;
        (response->authenticationToken).identifier.string.length = sVar2;
        (response->authenticationToken).identifier.string.data =
             (local_50->authenticationToken).identifier.string.data;
        UVar7 = UA_copy(&pUVar6->sessionName,&local_50->sessionName,UA_TYPES + 0xb);
        (response->responseHeader).serviceResult = UVar7;
        if ((pUVar5->clientDescription).applicationUri.data != (UA_Byte *)0x0) {
          UVar7 = UA_copy((void *)((pUVar5->clientDescription).productUri.length + 0x88),
                          &response->serverCertificate,UA_TYPES + 0xe);
          pUVar1 = &(response->responseHeader).serviceResult;
          *pUVar1 = *pUVar1 | UVar7;
        }
        if ((response->responseHeader).serviceResult != 0) {
          UA_SessionManager_removeSession((UA_SessionManager *)sm,&local_50->authenticationToken);
        }
      }
    }
  }
  return;
}

Assistant:

void Service_CreateSession(UA_Server *server, UA_SecureChannel *channel,
                           const UA_CreateSessionRequest *request,
                           UA_CreateSessionResponse *response) {
    if(channel->securityToken.channelId == 0) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADSECURECHANNELIDINVALID;
        return;
    }

    /* Copy the server's endpoint into the response */
    response->responseHeader.serviceResult =
        UA_Array_copy(server->endpointDescriptions, server->endpointDescriptionsSize,
                      (void**)&response->serverEndpoints, &UA_TYPES[UA_TYPES_ENDPOINTDESCRIPTION]);
    if(response->responseHeader.serviceResult != UA_STATUSCODE_GOOD)
        return;
    response->serverEndpointsSize = server->endpointDescriptionsSize;

    /* Mirror back the endpointUrl */
    for(size_t i = 0; i < response->serverEndpointsSize; ++i)
        UA_String_copy(&request->endpointUrl, &response->serverEndpoints[i].endpointUrl);

    UA_Session *newSession;
    response->responseHeader.serviceResult =
        UA_SessionManager_createSession(&server->sessionManager, channel, request, &newSession);
    if(response->responseHeader.serviceResult != UA_STATUSCODE_GOOD) {
        UA_LOG_DEBUG_CHANNEL(server->config.logger, channel, "Processing CreateSessionRequest failed");
        return;
    }

    newSession->maxResponseMessageSize = request->maxResponseMessageSize;
    newSession->maxRequestMessageSize = channel->connection->localConf.maxMessageSize;
    response->sessionId = newSession->sessionId;
    response->revisedSessionTimeout = (UA_Double)newSession->timeout;
    response->authenticationToken = newSession->authenticationToken;
    response->responseHeader.serviceResult = UA_String_copy(&request->sessionName, &newSession->sessionName);
    if(server->endpointDescriptionsSize > 0)
        response->responseHeader.serviceResult |=
            UA_ByteString_copy(&server->endpointDescriptions->serverCertificate,
                               &response->serverCertificate);
    if(response->responseHeader.serviceResult != UA_STATUSCODE_GOOD) {
        UA_SessionManager_removeSession(&server->sessionManager, &newSession->authenticationToken);
         return;
    }
    UA_LOG_DEBUG_CHANNEL(server->config.logger, channel, "Session " UA_PRINTF_GUID_FORMAT " created",
                         UA_PRINTF_GUID_DATA(newSession->sessionId.identifier.guid));
}